

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeEnter(Vdbe *p)

{
  int iVar1;
  Db *pDVar2;
  int nDb;
  Db *aDb;
  sqlite3 *db;
  yDbMask mask;
  int i;
  Vdbe *p_local;
  
  if (p->lockMask != 0) {
    pDVar2 = p->db->aDb;
    iVar1 = p->db->nDb;
    db._0_4_ = 1;
    for (db._4_4_ = 0; db._4_4_ < iVar1; db._4_4_ = db._4_4_ + 1) {
      if (((db._4_4_ != 1) && (((uint)db & p->lockMask) != 0)) &&
         (pDVar2[db._4_4_].pBt != (Btree *)0x0)) {
        sqlite3BtreeEnter(pDVar2[db._4_4_].pBt);
      }
      db._0_4_ = (uint)db * 2;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeEnter(Vdbe *p){
  int i;
  yDbMask mask;
  sqlite3 *db;
  Db *aDb;
  int nDb;
  if( p->lockMask==0 ) return;  /* The common case */
  db = p->db;
  aDb = db->aDb;
  nDb = db->nDb;
  for(i=0, mask=1; i<nDb; i++, mask += mask){
    if( i!=1 && (mask & p->lockMask)!=0 && ALWAYS(aDb[i].pBt!=0) ){
      sqlite3BtreeEnter(aDb[i].pBt);
    }
  }
}